

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  char *__s;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string descr;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((((byte)ctx[0x59] & 0x20) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_dataplus._M_p._0_1_ = 1;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])"self",(void **)(local_98 + 8),(handle *)&local_f8,
               (bool *)&local_d8);
  }
  plVar1 = *(long **)(this + 0x10);
  if (plVar1 != (long *)0x0) {
    *plVar1 = *plVar1 + 1;
    local_90._M_dataplus._M_p =
         (pointer)(CONCAT71(local_90._M_dataplus._M_p._1_7_,~(byte)this[8]) & 0xffffffffffffff01);
    pvVar2 = std::
             vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
             ::emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool>
                       ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                         *)(ctx + 0x18),(char **)this,(char **)(this + 0x18),(handle *)(this + 0x10)
                        ,(bool *)(local_98 + 8));
    return (int)pvVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_98 + 8),"\'",(allocator<char> *)&local_f8);
  if (*(char **)this != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,*(char **)this,(allocator<char> *)&local_b8);
    std::operator+(&local_f8,&local_d8,": ");
    std::__cxx11::string::append((string *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20),
                 "\'");
  std::__cxx11::string::append((string *)(local_98 + 8));
  std::__cxx11::string::~string((string *)&local_f8);
  __s = *(char **)ctx;
  if (((byte)ctx[0x59] & 0x20) == 0) {
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,__s,(allocator<char> *)&local_70);
      std::operator+(&local_d8," in function \'",&local_b8);
      std::operator+(&local_f8,&local_d8,"\'");
      std::__cxx11::string::append((string *)(local_98 + 8));
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  else {
    if (__s == (char *)0x0) {
      local_70._M_dataplus._M_p = (pointer)PyObject_Str(*(undefined8 *)(ctx + 0x68));
      str::operator_cast_to_string(&local_b8,(str *)&local_70);
      std::operator+(&local_d8," in method of \'",&local_b8);
      std::operator+(&local_f8,&local_d8,"\'");
      std::__cxx11::string::append((string *)(local_98 + 8));
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      this_00 = &local_70;
    }
    else {
      local_98 = (undefined1  [8])PyObject_Str(*(undefined8 *)(ctx + 0x68));
      str::operator_cast_to_string(&local_30,(str *)local_98);
      std::operator+(&local_70," in method \'",&local_30);
      std::operator+(&local_b8,&local_70,".");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,*(char **)ctx,&local_f9);
      std::operator+(&local_d8,&local_b8,&local_50);
      std::operator+(&local_f8,&local_d8,"\'");
      std::__cxx11::string::append((string *)(local_98 + 8));
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_30);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    }
    object::~object((object *)this_00);
  }
  std::operator+(&local_d8,"arg(): could not convert default argument ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 8)
                );
  std::operator+(&local_f8,&local_d8," into a Python object (type not registered yet?)");
  pybind11_fail(&local_f8);
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert);
    }